

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

EGLint deqp::egl::ChooseConfigRandomCase::getApiBits(Random *rnd)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  EGLint api;
  Random *rnd_local;
  
  bVar1 = de::Random::getBool(rnd);
  uVar3 = 0;
  if (bVar1) {
    uVar3 = 8;
  }
  bVar1 = de::Random::getBool(rnd);
  bVar2 = de::Random::getBool(rnd);
  uVar4 = 0;
  if (bVar2) {
    uVar4 = 4;
  }
  bVar2 = de::Random::getBool(rnd);
  uVar5 = 0;
  if (bVar2) {
    uVar5 = 2;
  }
  return uVar5 | uVar4 | bVar1 | uVar3;
}

Assistant:

static EGLint getApiBits (de::Random& rnd)
	{
		EGLint api = 0;
		api |= rnd.getBool() ? EGL_OPENGL_BIT		: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES2_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENVG_BIT		: 0;
		return api;
	}